

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour_correspondence.hpp
# Opt level: O0

ContourLandmarks *
eos::fitting::ContourLandmarks::load(ContourLandmarks *__return_storage_ptr__,string *filename)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
  *puVar1;
  bool bVar2;
  value_t vVar3;
  enable_if_t<detail::conjunction<std::is_integral<int>,_detail::negation<std::is_same<int,_bool>_>,_detail::negation<detail::is_exact_toml_type<int,_basic_value<discard_comments,_std::unordered_map,_std::vector>_>_>_>::value,_int>
  eVar4;
  value_type *v;
  enable_if_t<detail::is_exact_toml_type<unordered_map<basic_string<char>,_basic_value<discard_comments>_>,_basic_value<discard_comments,_std::unordered_map,_std::vector>_>::value,_std::unordered_map<std::__cxx11::basic_string<char>,_toml::basic_value<toml::discard_comments>_>_>
  *peVar5;
  mapped_type *pmVar6;
  enable_if_t<detail::is_exact_toml_type<vector<basic_value<discard_comments>_>,_basic_value<discard_comments,_std::unordered_map,_std::vector>_>::value,_std::vector<toml::basic_value<toml::discard_comments>_>_>
  *peVar7;
  enable_if_t<std::is_same<basic_string<char>,_std::string>::value,_std::string> *peVar8;
  runtime_error *prVar9;
  value_t t;
  value_t t_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  undefined1 local_208 [8];
  string value_1;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *landmark_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  enable_if_t<detail::is_exact_toml_type<vector<basic_value<discard_comments>_>,_basic_value<discard_comments,_std::unordered_map,_std::vector>_>::value,_std::vector<toml::basic_value<toml::discard_comments>_>_>
  *__range2_1;
  key_type local_1c0;
  enable_if_t<detail::is_exact_toml_type<vector<basic_value<discard_comments>_>,_basic_value<discard_comments,_std::unordered_map,_std::vector>_>::value,_std::vector<toml::basic_value<toml::discard_comments>_>_>
  *local_1a0;
  enable_if_t<detail::is_exact_toml_type<vector<basic_value<discard_comments>_>,_basic_value<discard_comments,_std::unordered_map,_std::vector>_>::value,_std::vector<toml::basic_value<toml::discard_comments>_>_>
  *left_contour;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  undefined1 local_130 [8];
  string value;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *landmark;
  const_iterator __end2;
  const_iterator __begin2;
  enable_if_t<detail::is_exact_toml_type<vector<basic_value<discard_comments>_>,_basic_value<discard_comments,_std::unordered_map,_std::vector>_>::value,_std::vector<toml::basic_value<toml::discard_comments>_>_>
  *__range2;
  key_type local_e8;
  enable_if_t<detail::is_exact_toml_type<vector<basic_value<discard_comments>_>,_basic_value<discard_comments,_std::unordered_map,_std::vector>_>::value,_std::vector<toml::basic_value<toml::discard_comments>_>_>
  *local_c8;
  enable_if_t<detail::is_exact_toml_type<vector<basic_value<discard_comments>_>,_basic_value<discard_comments,_std::unordered_map,_std::vector>_>::value,_std::vector<toml::basic_value<toml::discard_comments>_>_>
  *right_contour;
  key local_b8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
  *local_98;
  enable_if_t<detail::is_exact_toml_type<unordered_map<basic_string<char>,_basic_value<discard_comments>_>,_basic_value<discard_comments,_std::unordered_map,_std::vector>_>::value,_std::unordered_map<std::__cxx11::basic_string<char>,_toml::basic_value<toml::discard_comments>_>_>
  *contour_table;
  string local_80;
  undefined1 local_60 [8];
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> data;
  string *filename_local;
  ContourLandmarks *contour;
  
  data._64_8_ = filename;
  std::__cxx11::string::string((string *)&local_80,(string *)filename);
  toml::parse<toml::discard_comments,_std::unordered_map,_std::vector>
            ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)local_60,
             &local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"contour_landmarks",(allocator<char> *)((long)&right_contour + 7));
  v = toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::at
                ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)local_60,
                 &local_b8);
  peVar5 = toml::
           get<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::discard_comments,_std::unordered_map,_std::vector>
                     (v);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&right_contour + 7));
  right_contour._6_1_ = 0;
  local_98 = peVar5;
  ContourLandmarks(__return_storage_ptr__);
  puVar1 = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"right",(allocator<char> *)((long)&__range2 + 7));
  pmVar6 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
           ::at(puVar1,&local_e8);
  peVar7 = toml::
           get<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_toml::discard_comments,_std::unordered_map,_std::vector>
                     (pmVar6);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  local_c8 = peVar7;
  __end2 = std::
           vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
           ::begin(peVar7);
  landmark = (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
             std::
             vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
             ::end(peVar7);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_*,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                                *)&landmark);
    puVar1 = local_98;
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"left",(allocator<char> *)((long)&__range2_1 + 7));
      pmVar6 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
               ::at(puVar1,&local_1c0);
      peVar7 = toml::
               get<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_toml::discard_comments,_std::unordered_map,_std::vector>
                         (pmVar6);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
      local_1a0 = peVar7;
      __end2_1 = std::
                 vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                 ::begin(peVar7);
      landmark_1 = (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
                   std::
                   vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                   ::end(peVar7);
      do {
        bVar2 = __gnu_cxx::operator!=
                          (&__end2_1,
                           (__normal_iterator<const_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_*,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                            *)&landmark_1);
        if (!bVar2) {
          right_contour._6_1_ = 1;
          toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::~basic_value
                    ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
                     local_60);
          return __return_storage_ptr__;
        }
        value_1.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_*,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
             ::operator*(&__end2_1);
        std::__cxx11::string::string((string *)local_208);
        vVar3 = toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::type
                          ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
                           value_1.field_2._8_8_);
        if (vVar3 == integer) {
          eVar4 = toml::get<int,_toml::discard_comments,_std::unordered_map,_std::vector>
                            ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *
                             )value_1.field_2._8_8_);
          std::__cxx11::to_string(&local_228,eVar4);
          std::__cxx11::string::operator=((string *)local_208,(string *)&local_228);
          std::__cxx11::string::~string((string *)&local_228);
        }
        else {
          if (vVar3 != string) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            vVar3 = toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::type
                              ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector>
                                *)value_1.field_2._8_8_);
            toml::stringize<char,std::char_traits<char>,std::allocator<char>>
                      (&local_268,(toml *)(ulong)vVar3,t_00);
            std::operator+(&local_248,"unexpected type : ",&local_268);
            std::runtime_error::runtime_error(prVar9,(string *)&local_248);
            __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          peVar8 = toml::
                   get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::discard_comments,_std::unordered_map,_std::vector>
                             ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector>
                               *)value_1.field_2._8_8_);
          std::__cxx11::string::operator=((string *)local_208,(string *)peVar8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&__return_storage_ptr__->left_contour,(value_type *)local_208);
        std::__cxx11::string::~string((string *)local_208);
        __gnu_cxx::
        __normal_iterator<const_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_*,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
        ::operator++(&__end2_1);
      } while( true );
    }
    value.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_*,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
         ::operator*(&__end2);
    std::__cxx11::string::string((string *)local_130);
    vVar3 = toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::type
                      ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
                       value.field_2._8_8_);
    if (vVar3 == integer) {
      eVar4 = toml::get<int,_toml::discard_comments,_std::unordered_map,_std::vector>
                        ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
                         value.field_2._8_8_);
      std::__cxx11::to_string(&local_150,eVar4);
      std::__cxx11::string::operator=((string *)local_130,(string *)&local_150);
      std::__cxx11::string::~string((string *)&local_150);
    }
    else {
      if (vVar3 != string) {
        left_contour._7_1_ = 1;
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        vVar3 = toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::type
                          ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
                           value.field_2._8_8_);
        toml::stringize<char,std::char_traits<char>,std::allocator<char>>
                  (&local_190,(toml *)(ulong)vVar3,t);
        std::operator+(&local_170,"unexpected type : ",&local_190);
        std::runtime_error::runtime_error(prVar9,(string *)&local_170);
        left_contour._7_1_ = 0;
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      peVar8 = toml::
               get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::discard_comments,_std::unordered_map,_std::vector>
                         ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
                          value.field_2._8_8_);
      std::__cxx11::string::operator=((string *)local_130,(string *)peVar8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&__return_storage_ptr__->right_contour,(value_type *)local_130);
    std::__cxx11::string::~string((string *)local_130);
    __gnu_cxx::
    __normal_iterator<const_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_*,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

static ContourLandmarks load(std::string filename)
    {
        // parse() as well as extracting the data can throw std::runtime error or toml::exception,
        // so ideally you'd want to call this c'tor within a try-catch.
        const auto data = toml::parse(filename);

        // Todo: Handle the case when '[contour_landmarks]' is empty - now it just throws. Use
        // std::unordered_map::count.
        const auto& contour_table = toml::get<toml::table>(data.at("contour_landmarks"));

        ContourLandmarks contour;
        // There might be a vector<string> or a vector<int>, we need to check for that and convert to vector<string>.
        // Todo: Again, check whether the key exists first.
        // Read all the "right" contour landmarks:
        const auto& right_contour = toml::get<std::vector<toml::value>>(contour_table.at("right"));
        for (const auto& landmark : right_contour)
        {
            std::string value;
            switch (landmark.type())
            {
            case toml::value_t::integer:
                value = std::to_string(toml::get<int>(landmark));
                break;
            case toml::value_t::string:
                value = toml::get<std::string>(landmark);
                break;
            default:
                throw std::runtime_error("unexpected type : " + toml::stringize(landmark.type()));
            }
            contour.right_contour.push_back(value);
        }
        // Now the same for all the "left" contour landmarks:
        const auto& left_contour = toml::get<std::vector<toml::value>>(contour_table.at("left"));
        for (const auto& landmark : left_contour)
        {
            std::string value;
            switch (landmark.type())
            {
            case toml::value_t::integer:
                value = std::to_string(toml::get<int>(landmark));
                break;
            case toml::value_t::string:
                value = toml::get<std::string>(landmark);
                break;
            default:
                throw std::runtime_error("unexpected type : " + toml::stringize(landmark.type()));
            }
            contour.left_contour.push_back(value);
        }

        return contour;
    }